

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

AggregateFunction * __thiscall
duckdb::GetTypedEntropyFunction<int,duckdb::ModeStandard<int>>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  LogicalType *in_RCX;
  LogicalType LStack_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,(LogicalType *)this);
  LogicalType::LogicalType(&LStack_38,DOUBLE);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<int,duckdb::ModeStandard<int>>,int,double,duckdb::EntropyFunction<duckdb::ModeStandard<int>>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffe0,&LStack_38,in_RCX)
  ;
  LogicalType::~LogicalType(&LStack_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  (__return_storage_ptr__->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedEntropyFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = EntropyFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, double, OP, AggregateDestructorType::LEGACY>(
	        type, LogicalType::DOUBLE);
	func.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return func;
}